

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O2

int __thiscall
testing::internal::UnitTestImpl::FilterTests(UnitTestImpl *this,ReactionToSharding shard_tests)

{
  pointer ppTVar1;
  TestCase *pTVar2;
  long lVar3;
  bool bVar4;
  bool bVar5;
  bool bVar6;
  int iVar7;
  int iVar8;
  ulong uVar9;
  string local_98;
  undefined1 local_78 [8];
  string test_name;
  int local_40;
  allocator<char> local_35;
  int local_34;
  
  if (shard_tests == HONOR_SHARDING_PROTOCOL) {
    local_40 = Int32FromEnvOrDie("GTEST_TOTAL_SHARDS",-1);
    iVar7 = Int32FromEnvOrDie("GTEST_SHARD_INDEX",-1);
  }
  else {
    iVar7 = -1;
    local_40 = iVar7;
  }
  iVar8 = 0;
  local_34 = 0;
  for (test_name.field_2._8_8_ = 0;
      ppTVar1 = (this->test_cases_).
                super__Vector_base<testing::TestCase_*,_std::allocator<testing::TestCase_*>_>.
                _M_impl.super__Vector_impl_data._M_start,
      (ulong)test_name.field_2._8_8_ <
      (ulong)((long)(this->test_cases_).
                    super__Vector_base<testing::TestCase_*,_std::allocator<testing::TestCase_*>_>.
                    _M_impl.super__Vector_impl_data._M_finish - (long)ppTVar1 >> 3);
      test_name.field_2._8_8_ = test_name.field_2._8_8_ + 1) {
    pTVar2 = ppTVar1[test_name.field_2._8_8_];
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_98,(pTVar2->name_)._M_dataplus._M_p,(allocator<char> *)local_78);
    pTVar2->should_run_ = false;
    for (uVar9 = 0;
        lVar3 = *(long *)&(pTVar2->test_info_list_).
                          super__Vector_base<testing::TestInfo_*,_std::allocator<testing::TestInfo_*>_>
                          ._M_impl.super__Vector_impl_data,
        uVar9 < (ulong)((long)*(pointer *)
                               ((long)&(pTVar2->test_info_list_).
                                       super__Vector_base<testing::TestInfo_*,_std::allocator<testing::TestInfo_*>_>
                                       ._M_impl + 8) - lVar3 >> 3); uVar9 = uVar9 + 1) {
      lVar3 = *(long *)(lVar3 + uVar9 * 8);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)local_78,*(char **)(lVar3 + 0x20),&local_35);
      bVar4 = UnitTestOptions::MatchesFilter(&local_98,"DISABLED_*:*/DISABLED_*");
      bVar5 = true;
      if (!bVar4) {
        bVar5 = UnitTestOptions::MatchesFilter((string *)local_78,"DISABLED_*:*/DISABLED_*");
      }
      *(bool *)(lVar3 + 0x81) = bVar5;
      bVar6 = UnitTestOptions::FilterMatchesTest(&local_98,(string *)local_78);
      *(bool *)(lVar3 + 0x82) = bVar6;
      bVar6 = (bool)((bVar5 ^ 1U | FLAGS_gtest_also_run_disabled_tests) & bVar6);
      bVar4 = bVar6;
      if ((shard_tests != IGNORE_SHARDING_PROTOCOL) && (bVar6 != false)) {
        bVar4 = local_34 % local_40 == iVar7;
      }
      local_34 = local_34 + (uint)bVar6;
      iVar8 = iVar8 + (uint)bVar4;
      *(bool *)(lVar3 + 0x80) = bVar4;
      pTVar2->should_run_ = (bool)(pTVar2->should_run_ | bVar4);
      std::__cxx11::string::~string((string *)local_78);
    }
    std::__cxx11::string::~string((string *)&local_98);
  }
  return iVar8;
}

Assistant:

int UnitTestImpl::FilterTests(ReactionToSharding shard_tests) {
  const Int32 total_shards = shard_tests == HONOR_SHARDING_PROTOCOL ?
      Int32FromEnvOrDie(kTestTotalShards, -1) : -1;
  const Int32 shard_index = shard_tests == HONOR_SHARDING_PROTOCOL ?
      Int32FromEnvOrDie(kTestShardIndex, -1) : -1;

  // num_runnable_tests are the number of tests that will
  // run across all shards (i.e., match filter and are not disabled).
  // num_selected_tests are the number of tests to be run on
  // this shard.
  int num_runnable_tests = 0;
  int num_selected_tests = 0;
  for (size_t i = 0; i < test_cases_.size(); i++) {
    TestCase* const test_case = test_cases_[i];
    const std::string &test_case_name = test_case->name();
    test_case->set_should_run(false);

    for (size_t j = 0; j < test_case->test_info_list().size(); j++) {
      TestInfo* const test_info = test_case->test_info_list()[j];
      const std::string test_name(test_info->name());
      // A test is disabled if test case name or test name matches
      // kDisableTestFilter.
      const bool is_disabled =
          internal::UnitTestOptions::MatchesFilter(test_case_name,
                                                   kDisableTestFilter) ||
          internal::UnitTestOptions::MatchesFilter(test_name,
                                                   kDisableTestFilter);
      test_info->is_disabled_ = is_disabled;

      const bool matches_filter =
          internal::UnitTestOptions::FilterMatchesTest(test_case_name,
                                                       test_name);
      test_info->matches_filter_ = matches_filter;

      const bool is_runnable =
          (GTEST_FLAG(also_run_disabled_tests) || !is_disabled) &&
          matches_filter;

      const bool is_selected = is_runnable &&
          (shard_tests == IGNORE_SHARDING_PROTOCOL ||
           ShouldRunTestOnShard(total_shards, shard_index,
                                num_runnable_tests));

      num_runnable_tests += is_runnable;
      num_selected_tests += is_selected;

      test_info->should_run_ = is_selected;
      test_case->set_should_run(test_case->should_run() || is_selected);
    }
  }
  return num_selected_tests;
}